

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btHashString>::push_back
          (btAlignedObjectArray<btHashString> *this,btHashString *_Val)

{
  btHashString *pbVar1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  int _Count;
  
  iVar4 = this->m_size;
  if (iVar4 == this->m_capacity) {
    _Count = 1;
    if (iVar4 != 0) {
      _Count = iVar4 * 2;
    }
    reserve(this,_Count);
    iVar4 = this->m_size;
  }
  uVar2 = _Val->m_hash;
  uVar3 = *(undefined4 *)&_Val->field_0xc;
  pbVar1 = this->m_data + iVar4;
  pbVar1->m_string = _Val->m_string;
  pbVar1->m_hash = uVar2;
  *(undefined4 *)&pbVar1->field_0xc = uVar3;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}